

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

void __thiscall libebml::EbmlElement::EbmlElement(EbmlElement *this,EbmlElement *ElementToClone)

{
  EbmlElement *ElementToClone_local;
  EbmlElement *this_local;
  
  this->_vptr_EbmlElement = (_func_int **)&PTR__EbmlElement_00236540;
  this->Size = ElementToClone->Size;
  this->DefaultSize = ElementToClone->DefaultSize;
  this->SizeLength = ElementToClone->SizeLength;
  this->bSizeIsFinite = (bool)(ElementToClone->bSizeIsFinite & 1);
  this->ElementPosition = ElementToClone->ElementPosition;
  this->SizePosition = ElementToClone->SizePosition;
  this->bValueIsSet = (bool)(ElementToClone->bValueIsSet & 1);
  this->DefaultIsSet = (bool)(ElementToClone->DefaultIsSet & 1);
  this->bLocked = (bool)(ElementToClone->bLocked & 1);
  return;
}

Assistant:

EbmlElement::EbmlElement(const EbmlElement & ElementToClone)
  :Size(ElementToClone.Size)
  ,DefaultSize(ElementToClone.DefaultSize)
  ,SizeLength(ElementToClone.SizeLength)
  ,bSizeIsFinite(ElementToClone.bSizeIsFinite)
  ,ElementPosition(ElementToClone.ElementPosition)
  ,SizePosition(ElementToClone.SizePosition)
  ,bValueIsSet(ElementToClone.bValueIsSet)
  ,DefaultIsSet(ElementToClone.DefaultIsSet)
  ,bLocked(ElementToClone.bLocked)
{
}